

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  MElementType MVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint uVar9;
  int64_t size;
  int orientednode;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  TPZManVector<long,_4> nodeindices;
  int64_t index;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide BCGelside;
  TPZStack<int,_10> LowAllSides;
  TPZGeoElSide thisside;
  TPZManVector<long,_4> local_180;
  undefined1 local_140 [8];
  TPZManVector<int,_27> local_138;
  TPZGeoElSide local_a8;
  TPZManVector<int,_10> local_90;
  TPZGeoElSide local_48;
  TPZGeoEl *gel;
  
  if ((uint)side < 3) {
    MVar3 = pztopology::TPZLine::Type(side);
    uVar4 = pztopology::TPZLine::NSideNodes(side);
    switch(MVar3) {
    case EPoint:
      size = 1;
      break;
    case EOned:
      size = 3;
      break;
    case ETriangle:
      size = 7;
      break;
    case EQuadrilateral:
      size = 9;
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    local_90.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
    TPZManVector<int,_27>::TPZManVector(&local_138,size,(int *)&local_90);
    auVar2 = _DAT_014f8350;
    uVar9 = (int)size + (uint)((int)size == 0);
    lVar7 = (ulong)uVar9 - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_014f8350;
    auVar11 = _DAT_014f8340;
    do {
      auVar12 = auVar11 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        local_138.super_TPZVec<int>.fStore[uVar8] = (int)uVar8;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        local_138.super_TPZVec<int>.fStore[uVar8 + 1] = (int)uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar7 + 2;
    } while ((uVar9 + 1 & 0x1e) != uVar8);
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_90);
    pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_90);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_90,side);
    TPZManVector<long,_4>::TPZManVector(&local_180,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        lVar7 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar8 & 0xffffffff);
        local_180.super_TPZVec<long>.fStore[uVar8] = lVar7;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    MVar3 = pztopology::TPZLine::Type(side);
    pTVar1 = (this->super_TPZGeoEl).fMesh;
    iVar5 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar1,(ulong)MVar3,&local_180,(ulong)(uint)bc,local_140,1);
    gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar5);
    TPZGeoElSide::TPZGeoElSide(&local_a8,gel);
    local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_48.fGeoEl = &this->super_TPZGeoEl;
    local_48.fSide = side;
    TPZGeoElSide::InsertConnectivity(&local_a8,&local_48,&local_138.super_TPZVec<int>);
    (**(code **)(*(long *)gel + 0x78))(gel);
    if (local_180.super_TPZVec<long>.fStore == local_180.fExtAlloc) {
      local_180.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_180.super_TPZVec<long>.fNAlloc = 0;
    local_180.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_180.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_180.super_TPZVec<long>.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_90);
    if (local_138.super_TPZVec<int>.fStore == local_138.fExtAlloc) {
      local_138.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_138.super_TPZVec<int>.fNAlloc = 0;
    local_138.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_138.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_138.super_TPZVec<int>.fStore);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    gel = (TPZGeoEl *)0x0;
  }
  return gel;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}